

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_InStateSequence
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  long *plVar2;
  PClass *pPVar3;
  int iVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  long *plVar7;
  long *plVar8;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar5 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar1[1];
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar11) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar11 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042c6ae;
        }
      }
      if (numparam == 1) {
        pcVar10 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x03') {
          if (numparam < 3) {
            pcVar10 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x03') {
              plVar7 = (long *)param[2].field_0.field_1.a;
              iVar4 = 0;
              uVar9 = 0;
              if (plVar7 != (long *)0x0) {
                do {
                  bVar11 = plVar7 == (long *)param[1].field_0.field_1.a;
                  if (bVar11) goto LAB_0042c611;
                  plVar2 = (long *)*plVar7;
                  plVar8 = plVar7 + 5;
                  plVar7 = plVar2;
                } while (plVar2 == plVar8);
                bVar11 = false;
LAB_0042c611:
                uVar9 = (uint)bVar11;
              }
              if (0 < numret) {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x248,
                                "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\0') {
                  __assert_fail("RegType == REGT_INT",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x13f,"void VMReturn::SetInt(int)");
                }
                *(uint *)ret->Location = uVar9;
                iVar4 = 1;
              }
              return iVar4;
            }
            pcVar10 = "param[paramnum].Type == REGT_POINTER";
          }
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x247,
                        "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar10 = "param[paramnum].Type == REGT_POINTER";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x246,
                    "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042c6ae:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x245,
                "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, InStateSequence)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER(newstate, FState);
	PARAM_POINTER(basestate, FState);
	ACTION_RETURN_BOOL(self->InStateSequence(newstate, basestate));
}